

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

int freehand(void)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  if (uwep != (obj *)0x0) {
    iVar1 = welded(uwep);
    if ((iVar1 != 0) &&
       (((byte)(uwep->oclass | 4U) != 6 || (uVar2 = 0, (objects[uwep->otyp].field_0x11 & 1) == 0))))
    {
      uVar2 = 1;
      if (uarms != (obj *)0x0) {
        uVar2 = ~*(uint *)&uarms->field_0x4a & 1;
      }
    }
  }
  return uVar2;
}

Assistant:

int freehand(void)
{
	return(!uwep || !welded(uwep) ||
	   (!bimanual(uwep) && (!uarms || !uarms->cursed)));
/*	if ((uwep && bimanual(uwep)) ||
	    (uwep && uarms))
		return 0;
	else
		return 1;*/
}